

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_merge_sort_in_place(int64_t *dst,size_t len)

{
  int64_t iVar1;
  int64_t _sort_swap_temp;
  long lVar2;
  int64_t *piVar3;
  size_t sVar4;
  int64_t *piVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong l1;
  ulong uVar9;
  ulong r;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  bool bVar13;
  
  do {
    r = 2;
    if (0xf < len) {
      lVar2 = 0x3f;
      if (len != 0) {
        for (; len >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      r = 1L << ((byte)((((uint)lVar2 ^ 0x3f) * -2 + 0x7c) / 3) & 0x3f);
    }
    if (len < 2) {
      return;
    }
    if (len < 0x11) {
      sorter_bitonic_sort(dst,len);
      return;
    }
    uVar8 = (len / r - 1) * r;
    if (1 < uVar8) {
      uVar12 = 2;
      piVar11 = dst + -1;
      piVar3 = dst + 2;
      do {
        lVar2 = piVar11[2];
        if (lVar2 < piVar11[1]) {
          piVar11[2] = piVar11[1];
          piVar11[1] = lVar2;
        }
        piVar11 = piVar11 + 2;
        if ((uVar12 & 2) == 0) {
          uVar6 = len - uVar12;
          l1 = 2;
LAB_0010c5af:
          if (*(long *)((long)piVar11 + ((long)-(l1 << 0x20) >> 0x1d)) <= piVar11[1 - l1])
          goto code_r0x0010c5d1;
          uVar10 = l1;
          if (uVar6 <= l1) goto LAB_0010c681;
          lVar2 = -l1;
          do {
            iVar1 = piVar3[lVar2];
            piVar3[lVar2] = dst[len + lVar2];
            dst[len + lVar2] = iVar1;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0);
          uVar10 = l1 * 2;
          uVar9 = l1;
          if ((uVar10 & uVar12) == 0 && (uVar10 < uVar6 || uVar10 - uVar6 == 0)) {
            do {
              l1 = uVar10;
              sorter_merge_sort_in_place_frontmerge
                        (dst + (uVar12 - l1),uVar9,dst + (len - l1) + uVar9,uVar9);
              uVar10 = l1 * 2;
              if (uVar6 < uVar10) break;
              uVar9 = l1;
            } while ((uVar10 & uVar12) == 0);
          }
          sorter_merge_sort_in_place_backmerge(dst + (len - 1),l1,piVar11 + -l1,l1);
          l1 = uVar10;
LAB_0010c681:
          do {
            uVar9 = l1;
            l1 = uVar9 >> 1;
          } while (uVar6 < uVar9);
          while ((uVar10 & uVar12) == 0) {
            sorter_merge_sort_in_place_rmerge
                      (dst + uVar12 + uVar10 * -2,uVar10 * 2,uVar10 & 0x7ffffffffffffffe,uVar9);
            uVar10 = uVar10 * 2;
          }
        }
LAB_0010c6ca:
        uVar12 = uVar12 + 2;
        piVar3 = piVar3 + 2;
      } while (uVar12 <= uVar8);
    }
    if (r < uVar8) {
      sVar4 = 0;
      uVar12 = r;
      do {
        if (((uVar12 & uVar8) != 0) &&
           (sVar7 = sVar4 + uVar12, bVar13 = sVar4 != 0, sVar4 = sVar7, bVar13)) {
          sorter_merge_sort_in_place_rmerge(dst + (uVar8 - sVar7),sVar7,uVar12,r);
        }
        uVar12 = uVar12 * 2;
      } while (uVar12 < uVar8);
    }
    sVar7 = len - uVar8;
    piVar11 = dst + uVar8;
    sorter_merge_sort_in_place(piVar11,sVar7);
    piVar3 = piVar11;
    sVar4 = sVar7;
    piVar5 = dst;
    do {
      iVar1 = *piVar5;
      *piVar5 = *piVar3;
      *piVar3 = iVar1;
      piVar5 = piVar5 + 1;
      piVar3 = piVar3 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    sVar4 = sorter_merge_sort_in_place_backmerge(dst + (sVar7 - 1),sVar7,piVar11 + -1,uVar8 - sVar7)
    ;
    len = sVar7 + sVar4;
  } while( true );
code_r0x0010c5d1:
  l1 = l1 * 2;
  if ((l1 & uVar12) != 0) goto LAB_0010c6ca;
  goto LAB_0010c5af;
}

Assistant:

void MERGE_SORT_IN_PLACE(SORT_TYPE *dst, const size_t len) {
  /* don't bother sorting an array of size <= 1 */
  size_t r = rbnd(len);
  size_t lr = (len / r - 1) * r;
  SORT_TYPE *dst1 = dst - 1;
  size_t p, m, q, q1, p0;

  if (len <= 1) {
    return;
  }

  if (len <= SMALL_SORT_BND) {
    SMALL_SORT(dst, len);
    return;
  }

  for (p = 2; p <= lr; p += 2) {
    dst1 += 2;

    if (SORT_CMP(dst1[0], dst1[-1]) < 0) {
      SORT_SWAP(dst1[0], dst1[-1]);
    }

    if (p & 2) {
      continue;
    }

    m = len - p;
    q = 2;

    while ((p & q) == 0) {
      if (SORT_CMP(dst1[1 - q], dst1[-(int)q]) < 0) {
        break;
      }

      q *= 2;
    }

    if (p & q) {
      continue;
    }

    if (q < m) {
      p0 = len - q;
      MERGE_SORT_IN_PLACE_ASWAP(dst + p - q, dst + p0, q);

      for (;;) {
        q1 = 2 * q;

        if ((q1 > m) || (p & q1)) {
          break;
        }

        p0 = len - q1;
        MERGE_SORT_IN_PLACE_FRONTMERGE(dst + (p - q1), q, dst + p0 + q, q);
        q = q1;
      }

      MERGE_SORT_IN_PLACE_BACKMERGE(dst + (len - 1), q, dst1 - q, q);
      q *= 2;
    }

    q1 = q;

    while (q1 > m) {
      q1 /= 2;
    }

    while ((q & p) == 0) {
      q *= 2;
      MERGE_SORT_IN_PLACE_RMERGE(dst + (p - q), q, q / 2, q1);
    }
  }

  q1 = 0;

  for (q = r; q < lr; q *= 2) {
    if ((lr & q) != 0) {
      q1 += q;

      if (q1 != q) {
        MERGE_SORT_IN_PLACE_RMERGE(dst + (lr - q1), q1, q, r);
      }
    }
  }

  m = len - lr;
  MERGE_SORT_IN_PLACE(dst + lr, m);
  MERGE_SORT_IN_PLACE_ASWAP(dst, dst + lr, m);
  m += MERGE_SORT_IN_PLACE_BACKMERGE(dst + (m - 1), m, dst + (lr - 1), lr - m);
  MERGE_SORT_IN_PLACE(dst, m);
}